

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O2

void reset(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  vector<DiffLine,_std::allocator<DiffLine>_> result;
  string destination;
  string source;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (argc < 1) {
    puts("add need 1 or more arguments");
    return;
  }
  std::__cxx11::string::string((string *)&source,*argv,(allocator *)&destination);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 &STAGE_DIR_abi_cxx11_,"/");
  std::operator+(&destination,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 &source);
  std::__cxx11::string::~string((string *)&result);
  last_commit_hash_abi_cxx11_();
  hashToDir(&local_50,&local_70);
  std::operator+(&local_30,&local_50,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 &local_30,&source);
  std::__cxx11::string::operator=((string *)&source,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = file_exists(source._M_dataplus._M_p);
  if (bVar1) {
    bVar1 = file_exists(destination._M_dataplus._M_p);
    if (!bVar1) {
      iVar2 = creat(destination._M_dataplus._M_p,0x1ff);
      if (iVar2 == -1) {
        perror("creat");
        exit(1);
      }
    }
    std::__cxx11::string::string((string *)&local_90,(string *)&source);
    std::__cxx11::string::string((string *)&local_b0,(string *)&destination);
    diff_files(&result,&local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    if (result.super__Vector_base<DiffLine,_std::allocator<DiffLine>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        result.super__Vector_base<DiffLine,_std::allocator<DiffLine>_>._M_impl.
        super__Vector_impl_data._M_start) {
      puts("Nothing to reset");
    }
    else {
      copy((EVP_PKEY_CTX *)source._M_dataplus._M_p,(EVP_PKEY_CTX *)destination._M_dataplus._M_p);
    }
    std::vector<DiffLine,_std::allocator<DiffLine>_>::~vector(&result);
  }
  else {
    bVar1 = file_exists(destination._M_dataplus._M_p);
    if (bVar1) {
      unlink(destination._M_dataplus._M_p);
    }
    else {
      puts("Nothing to reset");
    }
  }
  std::__cxx11::string::~string((string *)&destination);
  std::__cxx11::string::~string((string *)&source);
  return;
}

Assistant:

void reset(int argc, char *argv[]){
    if(argc < 1){
        printf("add need 1 or more arguments\n");
    }
    else{
        String source = argv[0];
        String destination = STAGE_DIR + "/" + source;
        source = hashToDir(last_commit_hash()) + "/" + source;
        if(file_exists(source.c_str())){
            if(!file_exists(destination.c_str())){
                if(creat(destination.c_str(),DEFAULT_PERM)==-1){
                    perror("creat");
                    exit(EXIT_FAILURE);
                }
            }
            Vector<DiffLine> result = diff_files(source,destination);
            if(result.size()>0){
                copy(source.c_str(),destination.c_str());
            }
            else{
                printf("Nothing to reset\n");
            }
        }
        else{
            if(file_exists(destination.c_str())){
                unlink(destination.c_str());
            }
            else{
                printf("Nothing to reset\n");
            }
        }
    }
}